

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int read_double(coda_cursor *cursor,double *dst)

{
  coda_type_class cVar1;
  ulong bit_offset_00;
  int iVar2;
  coda_type *local_48;
  anon_union_8_2_7d4d42e3 data;
  coda_endianness endianness;
  int64_t bit_offset;
  coda_type *type;
  double *dst_local;
  coda_cursor *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_48 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_48 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  bit_offset_00 = cursor->stack[cursor->n + -1].bit_offset;
  cVar1 = local_48[1].type_class;
  if ((bit_offset_00 & 7) == 0) {
    iVar2 = read_bytes(cursor->product,(long)bit_offset_00 >> 3,8,dst);
    if (iVar2 != 0) {
      return -1;
    }
  }
  else {
    iVar2 = read_bits(cursor->product,bit_offset_00,0x40,(uint8_t *)dst);
    if (iVar2 != 0) {
      return -1;
    }
  }
  if (cVar1 == coda_record_class) {
    *dst = (double)CONCAT17(*(undefined1 *)dst,
                            CONCAT16(*(undefined1 *)((long)dst + 1),
                                     CONCAT15(*(undefined1 *)((long)dst + 2),
                                              CONCAT14(*(undefined1 *)((long)dst + 3),
                                                       CONCAT13(*(undefined1 *)((long)dst + 4),
                                                                CONCAT12(*(undefined1 *)
                                                                          ((long)dst + 5),
                                                                         CONCAT11(*(undefined1 *)
                                                                                   ((long)dst + 6),
                                                                                  *(undefined1 *)
                                                                                   ((long)dst + 7)))
                                                               )))));
  }
  return 0;
}

Assistant:

static int read_double(const coda_cursor *cursor, double *dst)
{
    coda_type *type;

    type = (coda_type *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class == coda_special_class)
    {
        if (((coda_type_special *)type)->special_type == coda_special_time)
        {
            return read_time(cursor, dst);
        }
        if (((coda_type_special *)type)->special_type == coda_special_vsf_integer)
        {
            return read_vsf_integer(cursor, dst);
        }
    }
    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_read_double(cursor, dst);
        case coda_backend_binary:
            return coda_bin_cursor_read_double(cursor, dst);
        case coda_backend_memory:
            return coda_mem_cursor_read_double(cursor, dst);
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_cursor_read_double(cursor, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_cursor_read_double(cursor, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            return coda_cdf_cursor_read_double(cursor, dst);
        case coda_backend_netcdf:
            return coda_netcdf_cursor_read_double(cursor, dst);
        case coda_backend_grib:
            break;
    }

    assert(0);
    exit(1);
}